

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O2

int ReadSymTab(char *label)

{
  int iVar1;
  size_t sVar2;
  SymTab *pSVar3;
  char wnum [6];
  char wlab [128];
  
  strcpy(wlab,label);
  if (9 < (byte)(*label - 0x30U)) {
    if (*label != '\\') goto LAB_0010b374;
    sVar2 = strlen(wlab);
    (wlab + sVar2)[0] = '$';
    (wlab + sVar2)[1] = '\0';
  }
  sprintf(wnum,"%d",(ulong)(uint)LabLine);
  strcat(wlab,wnum);
LAB_0010b374:
  pSVar3 = (SymTab *)HashIt(wlab);
  do {
    pSVar3 = pSVar3->Link;
    if (pSVar3 == (SymTab *)0x0) {
      Sym = pSVar3;
      Hunk2 = 0x7fff;
      DefLine2 = 0x7fff;
      Value = 0;
      return 0;
    }
    Sym = pSVar3;
    iVar1 = strcmp(pSVar3->Nam,wlab);
  } while (iVar1 != 0);
  Hunk2 = pSVar3->Hunk;
  if ((pSVar3->Flags & 9) == 0) {
    Hunk2 = Hunk2 & 0xffff;
  }
  Value = pSVar3->Val;
  DefLine2 = pSVar3->Defn;
  return 1;
}

Assistant:

int ReadSymTab(label)
	char label[];
/* Searches the symbol table for the given label.
 If not found, points Sym to NULL and returns FALSE.
 If found, points Sym to the proper table entry,
 and sets up the following fields:
 Value    - value of symbol
 Hunk2    - hunk number in which symbol resides
 ABSHUNK if value is absolute
 ones complement of symbol table index if external
 DefLine2 - statement number in which symbol was defined
 (NODEF if undefined )
 If the label is a local label (i.e. the first character is
 numeric), the current contents of LabLine will be converted
 to characters and appended to the label before it is searched.
 (This matches the way AddSymTab added the label to the table.)
 If the first character of the label is a backslash (i.e. a
 named local variable) a dollar sign will be appended to the
 label ahead of the value of LabLine.                       */
{
	char wlab[MAXLINE], wnum[6];
	register struct SymTab **hashindex;

	strcpy(wlab, label);
	if (((label[0] >= '0') && (label[0] <= '9')) || (label[0] == '\\')) {
		if (label[0] == '\\')
			strcat(wlab, "$");
		sprintf(wnum, "%d", LabLine); /* If it's a local label, */
		strcat(wlab, wnum); /*    append LabLine.     */
	}
	hashindex = HashIt(wlab); /* Get hash index. */
	Sym = *hashindex;
	while (Sym != NULL) {
		if (strcmp(Sym->Nam, wlab) == 0) {
			Value = Sym->Val; /* We found it. */
			Hunk2 = Sym->Hunk;
			if (!(Sym->Flags & 9))
				Hunk2 &= 0x0000FFFFL; /* Isolate hunk number. */
			DefLine2 = Sym->Defn;
			return (TRUE);
		}
		Sym = Sym->Link;
	}
	Value = 0; /* We didn't find it - */
	Hunk2 = ABSHUNK; /*  set value to absolute zero. */
	DefLine2 = NODEF;
	return (FALSE);
}